

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonLibTests_Marshall.c
# Opt level: O2

WJTL_STATUS TestMarshallBools(void)

{
  WJTL_STATUS WVar1;
  WJTL_STATUS WVar2;
  WJTL_STATUS WVar3;
  long lVar4;
  undefined8 *puVar5;
  JlMarshallElement *pJVar6;
  undefined1 local_99;
  JlMarshallElement marshalBoolStruct [1];
  
  puVar5 = &DAT_00142370;
  pJVar6 = marshalBoolStruct;
  for (lVar4 = 0xc; lVar4 != 0; lVar4 = lVar4 + -1) {
    *(undefined8 *)pJVar6 = *puVar5;
    puVar5 = puVar5 + 1;
    pJVar6 = (JlMarshallElement *)&pJVar6->Name;
  }
  local_99 = 1;
  WVar1 = MakeJsonAndVerify(&local_99,marshalBoolStruct,1,"{\"b\":true}");
  WjTestLib_Assert(WVar1 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(MakeJsonAndVerify( &theStruct, marshalBoolStruct, ( sizeof(marshalBoolStruct) / sizeof((marshalBoolStruct)[0]) ), \"{\\\"b\\\":true}\" ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Marshall.c"
                   ,"TestMarshallBools",0x1b9);
  local_99 = 0;
  WVar2 = MakeJsonAndVerify(&local_99,marshalBoolStruct,1,"{\"b\":false}");
  WjTestLib_Assert(WVar2 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(MakeJsonAndVerify( &theStruct, marshalBoolStruct, ( sizeof(marshalBoolStruct) / sizeof((marshalBoolStruct)[0]) ), \"{\\\"b\\\":false}\" ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Marshall.c"
                   ,"TestMarshallBools",0x1bc);
  WVar3 = WJTL_STATUS_FAILED;
  if (WVar2 == WJTL_STATUS_SUCCESS && WVar1 == WJTL_STATUS_SUCCESS) {
    WVar3 = WJTL_STATUS_SUCCESS;
  }
  return WVar3;
}

Assistant:

static
WJTL_STATUS
    TestMarshallBools
    (
        void
    )
{
    WJTL_STATUS TestReturn = WJTL_STATUS_SUCCESS;

    typedef struct
    {
        bool BoolValue;
    } BoolStruct;

    JlMarshallElement marshalBoolStruct[] =
    {
        JlMarshallBool( BoolStruct, BoolValue, "b" ),
    };

    BoolStruct theStruct = {0};

    theStruct.BoolValue = true;
    JL_ASSERT_SUCCESS( MakeJsonAndVerify( &theStruct, marshalBoolStruct, NumElements(marshalBoolStruct), "{\"b\":true}" ) );

    theStruct.BoolValue = false;
    JL_ASSERT_SUCCESS( MakeJsonAndVerify( &theStruct, marshalBoolStruct, NumElements(marshalBoolStruct), "{\"b\":false}" ) );

    return TestReturn;
}